

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
sort_tuples_and_give_result
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *vec)

{
  int *__args;
  iterator __position;
  long lVar1;
  _Tuple_impl<0UL,_int,_int> *p_Var2;
  tuple<int,_int> *ptVar3;
  ulong uVar4;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> sorted_vec;
  tuple<int,_int> *local_38;
  iterator iStack_30;
  tuple<int,_int> *local_28;
  
  local_28 = (tuple<int,_int> *)0x0;
  local_38 = (tuple<int,_int> *)0x0;
  iStack_30._M_current = (tuple<int,_int> *)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = &((vec->super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>)
             ._M_impl.super__Vector_impl_data._M_start)->super__Tuple_impl<0UL,_int,_int>;
  if (&((vec->super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>).
        _M_impl.super__Vector_impl_data._M_finish)->super__Tuple_impl<0UL,_int,_int> != p_Var2) {
    uVar4 = 0;
    do {
      if (uVar4 == 0) {
        if (iStack_30._M_current == local_28) {
          std::vector<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>::
          _M_realloc_insert<std::tuple<int,int>const&>
                    ((vector<std::tuple<int,int>,std::allocator<std::tuple<int,int>>> *)&local_38,
                     iStack_30,(tuple<int,_int> *)p_Var2);
        }
        else {
          (iStack_30._M_current)->super__Tuple_impl<0UL,_int,_int> = *p_Var2;
          iStack_30._M_current = iStack_30._M_current + 1;
        }
      }
      p_Var2 = &((vec->
                 super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start)->super__Tuple_impl<0UL,_int,_int>;
      lVar1 = (long)(vec->
                    super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var2;
      if (lVar1 != 0) {
        lVar1 = lVar1 >> 3;
        lVar1 = lVar1 + (ulong)(lVar1 == 0);
        do {
          if (local_38[uVar4].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
              super__Head_base<1UL,_int,_false>._M_head_impl ==
              (p_Var2->super__Head_base<0UL,_int,_false>)._M_head_impl) {
            if (iStack_30._M_current == local_28) {
              std::vector<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>::
              _M_realloc_insert<std::tuple<int,int>const&>
                        ((vector<std::tuple<int,int>,std::allocator<std::tuple<int,int>>> *)
                         &local_38,iStack_30,(tuple<int,_int> *)p_Var2);
            }
            else {
              (iStack_30._M_current)->super__Tuple_impl<0UL,_int,_int> = *p_Var2;
              iStack_30._M_current = iStack_30._M_current + 1;
            }
            break;
          }
          p_Var2 = p_Var2 + 1;
          lVar1 = lVar1 + -1;
        } while (lVar1 != 0);
      }
      uVar4 = uVar4 + 1;
      p_Var2 = &((vec->
                 super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start)->super__Tuple_impl<0UL,_int,_int>;
    } while (uVar4 < (ulong)((long)(vec->
                                   super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var2 >> 3))
    ;
    ptVar3 = local_38;
    if (iStack_30._M_current != local_38) {
      lVar1 = 4;
      uVar4 = 0;
      do {
        __args = (int *)((long)&(ptVar3->super__Tuple_impl<0UL,_int,_int>).
                                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                                _M_head_impl + lVar1);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,__args);
          ptVar3 = local_38;
        }
        else {
          *__position._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar4 = uVar4 + 1;
        lVar1 = lVar1 + 8;
      } while (uVar4 < (ulong)((long)iStack_30._M_current - (long)ptVar3 >> 3));
    }
    if (ptVar3 != (tuple<int,_int> *)0x0) {
      operator_delete(ptVar3,(long)local_28 - (long)ptVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> sort_tuples_and_give_result(std::vector<std::tuple<int,int>> &vec){
    std::vector<std::tuple<int,int>> sorted_vec;
    std::tuple<int,int> buff;
    std::vector<int> vec_results;


    for(int i=0; i<vec.size(); i++){
        if(i==0){
            sorted_vec.push_back(vec[i]);
        }
        buff = sorted_vec[i];
        for(int j=0; j<vec.size();j++){
            if(std::get<1>(buff)==std::get<0>(vec[j])){
                sorted_vec.push_back(vec[j]);
                break;

            }
        }
    }

    for(int i=0; i<sorted_vec.size(); i++){
        vec_results.push_back(std::get<0>(sorted_vec[i]));
    }
    return vec_results;
}